

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void units::addUnitPower(string *str,char *unit,int power,uint64_t flags)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  char cVar4;
  int iVar5;
  
  do {
    if (power == 0) {
      return;
    }
    cVar4 = (char)str;
    if ((str->_M_string_length == 0) ||
       (cVar1 = (str->_M_dataplus)._M_p[str->_M_string_length - 1], cVar1 == '*')) {
LAB_0015f5e4:
      bVar2 = false;
    }
    else {
      bVar2 = true;
      if (cVar1 != '/') {
        std::__cxx11::string::push_back(cVar4);
        goto LAB_0015f5e4;
      }
    }
    std::__cxx11::string::append((char *)str);
    if (power == 1) {
      return;
    }
    std::__cxx11::string::push_back(cVar4);
    uVar3 = -power;
    if (0 < power) {
      uVar3 = power;
    }
    if (uVar3 < 10) {
      if (power < 0) {
        std::__cxx11::string::push_back(cVar4);
      }
      std::__cxx11::string::push_back(cVar4);
      return;
    }
    iVar5 = -9;
    if (power < 0) {
      std::__cxx11::string::push_back(cVar4);
      iVar5 = 9;
    }
    std::__cxx11::string::push_back(cVar4);
    power = power + iVar5;
    if (bVar2) {
      std::__cxx11::string::push_back(cVar4);
    }
  } while( true );
}

Assistant:

static void addUnitPower(
    std::string& str,
    const char* unit,
    int power,
    std::uint64_t flags)
{
    bool div{false};
    if (power != 0) {
        if (!str.empty()) {
            if (str.back() != '/') {
                if (str.back() != '*') {
                    str.push_back('*');
                }
            } else {
                div = true;
            }
        }

        str.append(unit);
        if (power != 1) {
            str.push_back('^');
            if (std::labs(power) < 10) {
                if (power < 0) {
                    str.push_back('-');
                    str.push_back('0' - power);
                } else {
                    str.push_back('0' + power);
                }
            } else {
                if (allowLargePowers(flags)) {
                    str.push_back('(');
                    str.append(std::to_string(power));
                    str.push_back(')');
                } else {
                    if (power < 0) {
                        str.push_back('-');
                        str.push_back('9');
                        power += 9;
                    } else {
                        str.push_back('9');
                        power -= 9;
                    }
                    if (div) {
                        str.push_back('/');
                    }
                    addUnitPower(str, unit, power, flags);
                }
            }
        }
    }
}